

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int vm_builtin_getopt(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  char *zArgEnd;
  char cVar1;
  jx9_user_func *pjVar2;
  char *pcVar3;
  jx9_hashmap *pMap;
  char *pcVar4;
  jx9_value *pjVar5;
  jx9_value *pjVar6;
  ushort **ppuVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  char *pcVar11;
  jx9_vm *pjVar12;
  int need_val;
  char *pcVar13;
  int c;
  int nByte;
  getopt_long_opt sLong;
  int local_84;
  ulong local_80;
  jx9_value *local_78;
  jx9_value **local_70;
  jx9_value *local_68;
  int local_5c;
  char *local_58;
  char *local_50;
  jx9_value *local_48;
  jx9_value *local_40;
  jx9_context *local_38;
  
  if ((nArg < 1) || (((*apArg)->iFlags & 1) == 0)) {
    pjVar2 = pCtx->pFunc;
    pjVar12 = pCtx->pVm;
    pcVar8 = "Missing/Invalid option arguments";
  }
  else {
    pcVar8 = jx9_value_to_string(*apArg,&local_5c);
    pjVar12 = pCtx->pVm;
    pjVar5 = jx9_context_new_array(pCtx);
    pjVar6 = jx9_context_new_scalar(pCtx);
    if (pjVar6 != (jx9_value *)0x0 && pjVar5 != (jx9_value *)0x0) {
      uVar9 = (ulong)(pjVar12->sArgv).nByte;
      if (uVar9 != 0) {
        pcVar3 = (char *)(pjVar12->sArgv).pBlob;
        zArgEnd = pcVar3 + uVar9;
        local_78 = pjVar5;
        local_70 = apArg;
        local_58 = pcVar3;
        local_50 = zArgEnd;
        local_48 = pjVar6;
        local_40 = pjVar5;
        local_38 = pCtx;
        if (0 < local_5c) {
          pcVar13 = pcVar8 + local_5c;
          local_80 = uVar9;
          local_68 = pjVar6;
          ppuVar7 = __ctype_b_loc();
          uVar9 = local_80;
          do {
            cVar1 = *pcVar8;
            local_84 = (int)cVar1;
            pcVar11 = pcVar8 + 1;
            if (((*ppuVar7)[cVar1] & 8) != 0) {
              need_val = 0;
              uVar10 = uVar9;
              pcVar4 = pcVar3;
              if ((pcVar11 < pcVar13) && (*pcVar11 == ':')) {
                pcVar11 = pcVar8 + 2;
                need_val = 1;
                if ((pcVar11 < pcVar13) && (pcVar8[2] == ':')) {
                  pcVar11 = pcVar8 + 3;
                }
              }
              do {
                pcVar8 = pcVar4 + 1;
                if (((*pcVar4 == '-') && (pcVar8 < zArgEnd)) && (*pcVar8 == cVar1)) {
                  VmExtractOptArgValue
                            (local_78,local_68,pcVar8,zArgEnd,need_val,pCtx,(char *)&local_84);
                  uVar9 = local_80;
                  break;
                }
                uVar10 = uVar10 - 1;
                pcVar4 = pcVar8;
              } while (uVar10 != 0);
            }
            pcVar8 = pcVar11;
          } while (pcVar11 < pcVar13);
        }
        pjVar5 = local_78;
        if (((nArg != 1) && ((local_70[1]->iFlags & 0x40) != 0)) &&
           (pMap = (jx9_hashmap *)(local_70[1]->x).pOther, pMap->nEntry != 0)) {
          jx9HashmapWalk(pMap,VmProcessLongOpt,&local_58);
          pjVar5 = local_78;
        }
      }
      jx9_result_value(pCtx,pjVar5);
      return 0;
    }
    pjVar2 = pCtx->pFunc;
    pjVar12 = pCtx->pVm;
    pcVar8 = "JX9 is running out of memory";
  }
  jx9VmThrowError(pjVar12,&pjVar2->sName,1,pcVar8);
  pjVar5 = pCtx->pRet;
  jx9MemObjRelease(pjVar5);
  (pjVar5->x).rVal = 0.0;
  pjVar5->iFlags = pjVar5->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int vm_builtin_getopt(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zIn, *zEnd, *zArg, *zArgIn, *zArgEnd;
	struct getopt_long_opt sLong;
	jx9_value *pArray, *pWorker;
	SyBlob *pArg;
	int nByte;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "Missing/Invalid option arguments");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract option arguments */
	zIn  = jx9_value_to_string(apArg[0], &nByte);
	zEnd = &zIn[nByte];
	/* Point to the string representation of the $argv[] array */
	pArg = &pCtx->pVm->sArgv;
	/* Create a new empty array and a worker variable */
	pArray = jx9_context_new_array(pCtx);
	pWorker = jx9_context_new_scalar(pCtx);
	if( pArray == 0 || pWorker == 0 ){
		jx9_context_throw_error(pCtx,JX9_CTX_ERR, "JX9 is running out of memory");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	if( SyBlobLength(pArg) < 1 ){
		/* Empty command line, return the empty array*/
		jx9_result_value(pCtx, pArray);
		/* Everything will be released automatically when we return 
		 * from this function.
		 */
		return JX9_OK;
	}
	zArgIn = (const char *)SyBlobData(pArg);
	zArgEnd = &zArgIn[SyBlobLength(pArg)];
	/* Fill the long option structure */
	sLong.pArray = pArray;
	sLong.pWorker = pWorker;
	sLong.zArgIn =  zArgIn;
	sLong.zArgEnd = zArgEnd;
	sLong.pCtx = pCtx;
	/* Start processing */
	while( zIn < zEnd ){
		int c = zIn[0];
		int need_val = 0;
		/* Advance the stream cursor */
		zIn++;
		/* Ignore non-alphanum characters */
		if( !SyisAlphaNum(c) ){
			continue;
		}
		if( zIn < zEnd && zIn[0] == ':' ){
			zIn++;
			need_val = 1;
			if( zIn < zEnd && zIn[0] == ':' ){
				zIn++;
			}
		}
		/* Find option */
		zArg = VmFindShortOpt(c, zArgIn, zArgEnd);
		if( zArg == 0 ){
			/* No such option */
			continue;
		}
		/* Extract option argument value */
		VmExtractOptArgValue(pArray, pWorker, zArg, zArgEnd, need_val, pCtx, (const char *)&c);	
	}
	if( nArg > 1 && jx9_value_is_json_array(apArg[1]) && jx9_array_count(apArg[1]) > 0 ){
		/* Process long options */
		jx9_array_walk(apArg[1], VmProcessLongOpt, &sLong);
	}
	/* Return the option array */
	jx9_result_value(pCtx, pArray);
	/* 
	 * Don't worry about freeing memory, everything will be released
	 * automatically as soon we return from this foreign function.
	 */
	return JX9_OK;
}